

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperOffset::Clear(ClipperOffset *this)

{
  PolyNode *pPVar1;
  pointer ppPVar2;
  long lVar3;
  
  if (0 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_polyNodes).Childs.
                             super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar3 = 0;
    do {
      pPVar1 = (this->m_polyNodes).Childs.
               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar3];
      if (pPVar1 != (PolyNode *)0x0) {
        (*pPVar1->_vptr_PolyNode[1])();
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                         super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_polyNodes).Childs.
                                        super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  ppPVar2 = (this->m_polyNodes).Childs.
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_polyNodes).Childs.
      super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar2) {
    (this->m_polyNodes).Childs.
    super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar2;
  }
  (this->m_lowest).X = -1;
  return;
}

Assistant:

void ClipperOffset::Clear()
{
  for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    delete m_polyNodes.Childs[i];
  m_polyNodes.Childs.clear();
  m_lowest.X = -1;
}